

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
EmplaceHint<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>_>
::TestBody(EmplaceHint<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>_>
           *this)

{
  anon_union_8_1_a8a14541_for_iterator_1 *this_00;
  iterator i;
  const_iterator cVar1;
  iterator i_00;
  const_iterator cVar2;
  bool bVar3;
  reference ppVar4;
  char *pcVar5;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> pVar6;
  AssertHelper local_8c8;
  Message local_8c0;
  undefined1 local_8b8 [8];
  AssertionResult gtest_ar_1;
  const_iterator local_870;
  iterator local_840;
  Generator<int,_void> local_80d;
  int local_80c;
  undefined1 local_808 [8];
  T val2;
  Message local_7f0;
  undefined1 local_7e8 [8];
  AssertionResult gtest_ar;
  iterator local_7c8;
  const_iterator local_798;
  undefined1 auStack_768 [8];
  iterator it;
  TypeParam m;
  Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> local_21;
  undefined1 local_20 [8];
  T val;
  EmplaceHint<phmap::parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>_>
  *this_local;
  
  val._8_8_ = this;
  pVar6 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (&local_21);
  local_20 = (undefined1  [8])pVar6.first;
  val.first._0_4_ = pVar6.second;
  this_00 = &it.it_end_.field_1;
  parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
  ::parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
              *)this_00);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::end(&local_7c8,
        (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
         *)this_00);
  i.inner_end_ = local_7c8.inner_end_;
  i.inner_ = local_7c8.inner_;
  i.it_.ctrl_ = local_7c8.it_.ctrl_;
  i.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_7c8.it_.field_1.slot_;
  i.it_end_.ctrl_ = local_7c8.it_end_.ctrl_;
  i.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_7c8.it_end_.field_1.slot_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::const_iterator::const_iterator(&local_798,i);
  cVar1.iter_.inner_end_ = local_798.iter_.inner_end_;
  cVar1.iter_.inner_ = local_798.iter_.inner_;
  cVar1.iter_.it_.ctrl_ = local_798.iter_.it_.ctrl_;
  cVar1.iter_.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_798.iter_.it_.field_1.slot_;
  cVar1.iter_.it_end_.ctrl_ = local_798.iter_.it_end_.ctrl_;
  cVar1.iter_.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_798.iter_.it_end_.field_1.slot_;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::emplace_hint<std::pair<phmap::priv::hash_internal::EnumClass_const,int>&>
            ((iterator *)auStack_768,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)&it.it_end_.field_1,cVar1,
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_20);
  ppVar4 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
           ::iterator::operator*((iterator *)auStack_768);
  testing::internal::EqHelper::
  Compare<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_nullptr>
            ((EqHelper *)local_7e8,"val","*it",
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_20,ppVar4);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar3) {
    testing::Message::Message(&local_7f0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_7e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&val2.second,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x98,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&val2.second,&local_7f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&val2.second);
    testing::Message::~Message(&local_7f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  local_80c = hash_internal::Generator<int,_void>::operator()(&local_80d);
  std::pair<const_phmap::priv::hash_internal::EnumClass,_int>::pair<int,_true>
            ((pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_808,
             (EnumClass *)local_20,&local_80c);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )auStack_768;
  i_00.inner_end_ = it.inner_;
  i_00.inner_ = (Inner *)auStack_768;
  i_00.it_.ctrl_ = (ctrl_t *)it.inner_end_;
  i_00.it_.field_1.slot_ = (slot_type *)it.it_.ctrl_;
  i_00.it_end_.ctrl_ = (ctrl_t *)it.it_.field_1.slot_;
  i_00.it_end_.field_1.slot_ = (slot_type *)it.it_end_.ctrl_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::const_iterator::const_iterator(&local_870,i_00);
  cVar2.iter_.inner_end_ = local_870.iter_.inner_end_;
  cVar2.iter_.inner_ = local_870.iter_.inner_;
  cVar2.iter_.it_.ctrl_ = local_870.iter_.it_.ctrl_;
  cVar2.iter_.it_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_870.iter_.it_.field_1.slot_;
  cVar2.iter_.it_end_.ctrl_ = local_870.iter_.it_end_.ctrl_;
  cVar2.iter_.it_end_.field_1 =
       (anon_union_8_1_a8a14541_for_iterator_1)
       (anon_union_8_1_a8a14541_for_iterator_1)local_870.iter_.it_end_.field_1.slot_;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::emplace_hint<std::pair<phmap::priv::hash_internal::EnumClass_const,int>&>
            (&local_840,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)&it.it_end_.field_1,cVar2,
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_808);
  it.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)local_840.it_end_.ctrl_;
  it.it_end_.ctrl_ = (ctrl_t *)local_840.it_end_.field_1.slot_;
  it.inner_end_ = (Inner *)local_840.it_.ctrl_;
  it.it_.ctrl_ = (ctrl_t *)local_840.it_.field_1.slot_;
  auStack_768 = (undefined1  [8])local_840.inner_;
  it.inner_ = local_840.inner_end_;
  ppVar4 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
           ::iterator::operator*((iterator *)auStack_768);
  testing::internal::EqHelper::
  Compare<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_nullptr>
            ((EqHelper *)local_8b8,"val","*it",
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)local_20,ppVar4);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8b8);
  if (!bVar3) {
    testing::Message::Message(&local_8c0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_8b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_8c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x9b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_8c8,&local_8c0);
    testing::internal::AssertHelper::~AssertHelper(&local_8c8);
    testing::Message::~Message(&local_8c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8b8);
  parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
  ::~parallel_flat_hash_map
            ((parallel_flat_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_std::mutex>
              *)&it.it_end_.field_1);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, EmplaceHint) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  // TODO(alkis): We need a way to run emplace in a more meaningful way. Perhaps
  // with test traits/policy.
  auto it = m.emplace_hint(m.end(), val);
  EXPECT_EQ(val, *it);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  it = m.emplace_hint(it, val2);
  EXPECT_EQ(val, *it);
}